

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::
basicSubobjectAtIndex_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int subobjectIndex,int arraySize)

{
  bool bVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  int local_154;
  void *local_150;
  undefined1 local_148 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  ulong local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  VarType *local_118;
  long local_110;
  long local_108;
  BasicTypeIterator basicIt;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  TypeAccessFormat local_40;
  
  local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)this + 0x28);
  uVar2 = 0;
  iVar3 = 0;
  local_150 = this;
  do {
    local_154 = (int)uVar2;
    if (arraySize <= local_154) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,(char *)0x0,(allocator<char> *)&basicIt);
      return __return_storage_ptr__;
    }
    lVar4 = 0;
    local_128 = uVar2;
    while (lVar4 < (int)((*(long *)((long)local_150 + 0x50) - *(long *)((long)local_150 + 0x48)) /
                        0x38)) {
      local_110 = lVar4 * 0x38;
      local_118 = (VarType *)(*(long *)((long)local_150 + 0x48) + local_110 + 0x20);
      local_108 = lVar4;
      glu::SubTypeIterator<glu::IsBasicType>::SubTypeIterator(&basicIt,local_118);
      while( true ) {
        local_138._M_allocated_capacity = 0;
        local_138._8_8_ = (pointer)0x0;
        local_148._0_8_ = (VarType *)0x0;
        local_148._8_8_ = (pointer)0x0;
        bVar1 = glu::SubTypeIterator<glu::IsBasicType>::operator!=
                          (&basicIt,(SubTypeIterator<glu::IsBasicType> *)local_148);
        std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
        ~_Vector_base((_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> *
                      )(local_148 + 8));
        if (!bVar1) break;
        iVar3 = iVar3 + 1;
        if (subobjectIndex + 1 == iVar3) {
          std::operator+(&local_a0,local_120,"[");
          de::toString<int>(&local_c0,&local_154);
          std::operator+(&local_80,&local_a0,&local_c0);
          std::operator+(&local_60,&local_80,"].");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_148,&local_60,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_110 + *(long *)((long)local_150 + 0x48)));
          local_40.type = local_118;
          local_40.path = &basicIt.m_path;
          de::toString<glu::TypeAccessFormat>(&local_e0,&local_40);
          std::operator+(__return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_148,&local_e0);
          std::__cxx11::string::~string((string *)&local_e0);
          std::__cxx11::string::~string((string *)local_148);
          std::__cxx11::string::~string((string *)&local_60);
          std::__cxx11::string::~string((string *)&local_80);
          std::__cxx11::string::~string((string *)&local_c0);
          std::__cxx11::string::~string((string *)&local_a0);
          std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
          ~_Vector_base(&basicIt.m_path.
                         super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                       );
          return __return_storage_ptr__;
        }
        glu::SubTypeIterator<glu::IsBasicType>::operator++(&basicIt);
      }
      std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
      ~_Vector_base(&basicIt.m_path.
                     super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                   );
      lVar4 = local_108 + 1;
    }
    uVar2 = (ulong)((int)local_128 + 1);
  } while( true );
}

Assistant:

string UserDefinedIOCase::IOBlock::basicSubobjectAtIndex (int subobjectIndex, int arraySize) const
{
	int currentIndex = 0;
	for (int arrayNdx = 0; arrayNdx < arraySize; arrayNdx++)
	{
		for (int memberNdx = 0; memberNdx < (int)m_members.size(); memberNdx++)
		{
			const glu::VarType& membType = m_members[memberNdx].type;
			for (glu::BasicTypeIterator basicIt = glu::BasicTypeIterator::begin(&membType);
				 basicIt != glu::BasicTypeIterator::end(&membType);
				 ++basicIt)
			{
				if (currentIndex == subobjectIndex)
					return m_interfaceName + "[" + de::toString(arrayNdx) + "]." + m_members[memberNdx].name + de::toString(glu::TypeAccessFormat(membType, basicIt.getPath()));
				currentIndex++;
			}
		}
	}
	DE_ASSERT(false);
	return DE_NULL;
}